

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::IsFloat16Vector2Or4Type(ValidationState_t *this,uint32_t id)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint32_t id_00;
  Instruction *this_00;
  bool local_39;
  uint32_t vectorDim;
  Instruction *inst;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  this_00 = FindDef(this,id);
  if (this_00 == (Instruction *)0x0) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x3d6,
                  "bool spvtools::val::ValidationState_t::IsFloat16Vector2Or4Type(uint32_t) const");
  }
  OVar2 = val::Instruction::opcode(this_00);
  if (OVar2 == OpTypeVector) {
    uVar3 = GetDimension(this,id);
    id_00 = GetComponentType(this,id);
    bVar1 = IsFloatScalarType(this,id_00);
    local_39 = false;
    if ((bVar1) && ((uVar3 == 2 || (local_39 = false, uVar3 == 4)))) {
      uVar3 = GetComponentType(this,id);
      uVar3 = GetBitWidth(this,uVar3);
      local_39 = uVar3 == 0x10;
    }
    this_local._7_1_ = local_39;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::IsFloat16Vector2Or4Type(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  assert(inst);

  if (inst->opcode() == spv::Op::OpTypeVector) {
    uint32_t vectorDim = GetDimension(id);
    return IsFloatScalarType(GetComponentType(id)) &&
           (vectorDim == 2 || vectorDim == 4) &&
           (GetBitWidth(GetComponentType(id)) == 16);
  }

  return false;
}